

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::SingleKdTreeIndex::SerializeWithCachedSizes
          (SingleKdTreeIndex *this,CodedOutputStream *output)

{
  if (this->leafsize_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(1,this->leafsize_,output);
    return;
  }
  return;
}

Assistant:

void SingleKdTreeIndex::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.SingleKdTreeIndex)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int32 leafSize = 1;
  if (this->leafsize() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(1, this->leafsize(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.SingleKdTreeIndex)
}